

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

bool glcts::PipelineStatisticsQueryUtilities::executeQuery
               (GLenum query_type,GLuint qo_id,GLuint qo_bo_id,PFNQUERYDRAWHANDLERPROC pfn_draw,
               void *draw_user_arg,RenderContext *render_context,TestContext *test_context,
               ContextInfo *context_info,_test_execution_result *out_result)

{
  ostringstream *poVar1;
  ulong uVar2;
  RenderContext *pRVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType CVar7;
  undefined4 extraout_var;
  GLint *pGVar9;
  MessageBuilder *this;
  GLenum value;
  GLenum value_00;
  string *psVar10;
  GLuint GVar11;
  GLuint *pGVar12;
  GLuint64 *pGVar13;
  GLint n_query_bits;
  uchar *bo_data_ptr;
  GLuint local_210;
  GLint local_20c;
  ulong local_208;
  GLuint64 local_200;
  GLuint local_1f4;
  void *local_1f0;
  string local_1e8;
  int local_1c4;
  RenderContext *local_1c0;
  GLint *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar8;
  
  local_1f0 = draw_user_arg;
  iVar6 = (*render_context->_vptr_RenderContext[3])(render_context);
  lVar8 = CONCAT44(extraout_var,iVar6);
  local_1c4 = 0;
  local_208 = CONCAT44(local_208._4_4_,query_type);
  (**(code **)(lVar8 + 0xa28))(query_type,0x8864);
  iVar6 = (**(code **)(lVar8 + 0x800))();
  uVar2 = local_208;
  if (iVar6 == 0) {
    local_1c0 = render_context;
    if (local_1c4 == 0) {
      local_1b0._0_8_ = test_context->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Skipping [",10);
      getStringForEnum_abi_cxx11_
                (&local_1e8,(PipelineStatisticsQueryUtilities *)(local_208 & 0xffffffff),value_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"]: zero bits available for counter storage",0x2a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
    }
    else {
      (**(code **)(lVar8 + 0x20))(local_208 & 0xffffffff,qo_id);
      iVar6 = (**(code **)(lVar8 + 0x800))();
      if (iVar6 != 0) {
        local_1b0._0_8_ = test_context->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "A valid glBeginQuery() call generated the following error code:[",0x40);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00a3a88d;
      }
      bVar4 = glu::ContextInfo::isExtensionSupported(context_info,"GL_ARB_query_buffer_object");
      local_1f4 = 0;
      if ((qo_bo_id != 0) && (bVar4)) {
        (**(code **)(lVar8 + 0x40))(0x9192);
        iVar6 = (**(code **)(lVar8 + 0x800))();
        local_1f4 = qo_bo_id;
        if (iVar6 == 0) goto LAB_00a3a808;
        local_1b0._0_8_ = test_context->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Could not bind a buffer object to GL_QUERY_BUFFER buffer object binding point. Error reported:["
                   ,0x5f);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        (**(code **)(lVar8 + 0x628))(uVar2 & 0xffffffff);
        goto LAB_00a3a8a9;
      }
LAB_00a3a808:
      if (pfn_draw != (PFNQUERYDRAWHANDLERPROC)0x0) {
        (*pfn_draw)(local_1f0);
      }
      (**(code **)(lVar8 + 0x628))(uVar2 & 0xffffffff);
      iVar6 = (**(code **)(lVar8 + 0x800))();
      pRVar3 = local_1c0;
      if (iVar6 != 0) {
        local_1b0._0_8_ = test_context->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"glEndQuery() call failed with error code[",0x29);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00a3a88d;
      }
      bVar4 = true;
      local_208 = 0;
      do {
        local_1e8._M_dataplus._M_p = (char *)0x7fffffffffffffff;
        local_200 = 0xffffffffffffffff;
        local_20c = 0x7fffffff;
        local_210 = 0xffffffff;
        pGVar9 = (GLint *)0x0;
        if (bVar4) {
          pGVar9 = &local_20c;
        }
        psVar10 = (string *)0x8;
        if (bVar4) {
          psVar10 = &local_1e8;
        }
        pGVar12 = (GLuint *)&DAT_00000010;
        if (bVar4) {
          pGVar12 = &local_210;
        }
        pGVar13 = (GLuint64 *)0x18;
        if (bVar4) {
          pGVar13 = &local_200;
        }
        GVar11 = 0;
        if ((local_208 & 1) != 0) {
          GVar11 = local_1f4;
        }
        (**(code **)(lVar8 + 0x40))(0x9192,GVar11);
        iVar6 = (**(code **)(lVar8 + 0x800))();
        if (iVar6 != 0) {
          local_1b0._0_8_ = test_context->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "glBindBuffer() call failed for GL_QUERY_BUFFER target with error [",0x42);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00a3a88d;
        }
        CVar7.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])(pRVar3);
        bVar4 = glu::contextSupports(CVar7,(ApiType)0x133);
        local_1f0 = (void *)CONCAT71(local_1f0._1_7_,bVar4);
        if (bVar4) {
          (**(code **)(lVar8 + 0xa08))(qo_id,0x8866,psVar10);
          iVar6 = (**(code **)(lVar8 + 0x800))();
          if (iVar6 != 0) {
            local_1b0._0_8_ = test_context->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"glGetQueryObjecti64v() call failed with error [",0x2f);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00a3a88d;
          }
        }
        (**(code **)(lVar8 + 0xa10))(qo_id,0x8866,pGVar9);
        iVar6 = (**(code **)(lVar8 + 0x800))();
        if (iVar6 != 0) {
          local_1b0._0_8_ = test_context->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"glGetQueryObjectiv() call failed with error [",0x2d);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00a3a88d;
        }
        CVar7.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])(pRVar3);
        bVar5 = glu::contextSupports(CVar7,(ApiType)0x133);
        if (bVar5) {
          (**(code **)(lVar8 + 0xa18))(qo_id,0x8866,pGVar13);
          iVar6 = (**(code **)(lVar8 + 0x800))();
          if (iVar6 != 0) {
            local_1b0._0_8_ = test_context->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"glGetQueryObjectui64v() call failed with error [",0x30);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00a3a88d;
          }
        }
        (**(code **)(lVar8 + 0xa20))(qo_id,0x8866,pGVar12);
        iVar6 = (**(code **)(lVar8 + 0x800))();
        if (iVar6 != 0) {
          local_1b0._0_8_ = test_context->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"glGetQueryObjectuiv() call failed with error [",0x2e);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00a3a88d;
        }
        if ((local_208 & 1) != 0) {
          pGVar9 = (GLint *)(**(code **)(lVar8 + 0xcf8))(0x9192,35000);
          local_1b8 = pGVar9;
          iVar6 = (**(code **)(lVar8 + 0x800))();
          if (iVar6 != 0 || pGVar9 == (GLint *)0x0) {
            local_1b0._0_8_ = test_context->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"QO BO mapping failed with error [",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"] and data ptr returned:[",0x19);
            this = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(uchar **)&local_1b8)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&(this->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
            tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00a3a88d;
          }
          local_20c = *pGVar9;
          local_1e8._M_dataplus._M_p = *(pointer *)(pGVar9 + 2);
          local_210 = pGVar9[4];
          local_200 = *(GLuint64 *)(pGVar9 + 6);
          (**(code **)(lVar8 + 0x1670))(0x9192);
          iVar6 = (**(code **)(lVar8 + 0x800))();
          if (iVar6 != 0) {
            local_1b0._0_8_ = test_context->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"QO BO unmapping failed with error [",0x23);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00a3a88d;
          }
          out_result->result_qo_int = local_20c;
          out_result->result_qo_int64 = (GLint64)local_1e8._M_dataplus._M_p;
          out_result->result_qo_uint = local_210;
          out_result->result_qo_uint64 = local_200;
          out_result->int64_written = local_1f0._0_1_;
          out_result->uint64_written = bVar5;
          break;
        }
        bVar4 = false;
        out_result->result_int = local_20c;
        out_result->result_int64 = (GLint64)local_1e8._M_dataplus._M_p;
        out_result->result_uint = local_210;
        out_result->result_uint64 = local_200;
        out_result->int64_written = local_1f0._0_1_;
        out_result->uint64_written = bVar5;
        local_208 = CONCAT71((int7)((ulong)out_result >> 8),1);
      } while (local_1f4 != 0);
    }
    bVar4 = true;
  }
  else {
    local_1b0._0_8_ = test_context->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"glGetQueryiv() call failed for GL_QUERY_COUNTER_BITS pname and ",
               0x3f);
    getStringForEnum_abi_cxx11_
              (&local_1e8,(PipelineStatisticsQueryUtilities *)(local_208 & 0xffffffff),value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"query target.",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
LAB_00a3a88d:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
LAB_00a3a8a9:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool PipelineStatisticsQueryUtilities::executeQuery(glw::GLenum query_type, glw::GLuint qo_id, glw::GLuint qo_bo_id,
													PFNQUERYDRAWHANDLERPROC pfn_draw, void* draw_user_arg,
													const glu::RenderContext& render_context,
													tcu::TestContext&		  test_context,
													const glu::ContextInfo&   context_info,
													_test_execution_result*   out_result)
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = render_context.getFunctions();
	bool				  result	 = true;

	/* Check if the implementation provides non-zero number of bits for the query.
	 * Queries, for which GL implementations provide zero bits of space return
	 * indeterminate values, so we should skip them */
	glw::GLint n_query_bits = 0;

	gl.getQueryiv(query_type, GL_QUERY_COUNTER_BITS, &n_query_bits);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message
							  << "glGetQueryiv() call failed for GL_QUERY_COUNTER_BITS pname and "
							  << PipelineStatisticsQueryUtilities::getStringForEnum(query_type) << "query target."
							  << tcu::TestLog::EndMessage;

		return false;
	}

	if (n_query_bits == 0)
	{
		test_context.getLog() << tcu::TestLog::Message << "Skipping "
														  "["
							  << PipelineStatisticsQueryUtilities::getStringForEnum(query_type)
							  << "]"
								 ": zero bits available for counter storage"
							  << tcu::TestLog::EndMessage;

		return result;
	}

	/* Start the query */
	gl.beginQuery(query_type, qo_id);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message
							  << "A valid glBeginQuery() call generated the following error code:"
								 "["
							  << error_code << "]" << tcu::TestLog::EndMessage;

		return false;
	}

	/* If GL_ARB_query_buffer_object is supported and the caller supplied a BO id, use
	 * it before we fire any draw calls */
	if (context_info.isExtensionSupported("GL_ARB_query_buffer_object") && qo_bo_id != 0)
	{
		gl.bindBuffer(GL_QUERY_BUFFER, qo_bo_id);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message
								  << "Could not bind a buffer object to GL_QUERY_BUFFER buffer object "
									 "binding point. Error reported:"
									 "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			/* Stop the query before we leave */
			gl.endQuery(query_type);

			return false;
		} /* if (buffer binding operation failed) */
	}	 /* if (GL_ARB_query_buffer_object extension is supported and the supplied QO BO id
	 *     is not 0) */
	else
	{
		/* Reset the QO BO id, so that we can skip the checks later */
		qo_bo_id = 0;
	}

	/* Perform the draw calls, if any supplied call-back function pointer was supplied
	 * by the caller. */
	if (pfn_draw != DE_NULL)
	{
		pfn_draw(draw_user_arg);
	}

	/* End the query */
	gl.endQuery(query_type);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message << "glEndQuery() call failed with error code"
														  "["
							  << error_code << "]" << tcu::TestLog::EndMessage;

		return false;
	} /* if (glEndQuery() call failed) */

	/* We now need to retrieve the result data using all query getter functions
	 * GL has to offer. This will be handled in two iterations:
	 *
	 * 1. The data will be retrieved using the getters without a QO BO being bound.
	 * 2. If QO was provided, we will need to issue all getter calls executed against
	 *    the QO BO. We will then need to retrieve that data directly from the BO
	 *    storage.
	 */
	const unsigned int iteration_index_wo_qo_bo   = 0;
	const unsigned int iteration_index_with_qo_bo = 1;

	for (unsigned int n_iteration = 0; n_iteration < 2; /* as per description */
		 ++n_iteration)
	{
		glw::GLint*	offset_int			 = DE_NULL;
		glw::GLint64*  offset_int64			 = DE_NULL;
		glw::GLuint*   offset_uint			 = DE_NULL;
		glw::GLuint64* offset_uint64		 = DE_NULL;
		glw::GLint	 result_int			 = INT_MAX;
		glw::GLint64   result_int64			 = LLONG_MAX;
		bool		   result_int64_written  = false;
		glw::GLuint	result_uint			 = UINT_MAX;
		glw::GLuint64  result_uint64		 = ULLONG_MAX;
		bool		   result_uint64_written = false;

		/* Skip the QO BO iteration if QO BO id has not been provided */
		if (n_iteration == iteration_index_with_qo_bo && qo_bo_id == 0)
		{
			continue;
		}

		/* Determine the offsets we should use for the getter calls */
		if (n_iteration == iteration_index_wo_qo_bo)
		{
			offset_int	= &result_int;
			offset_int64  = &result_int64;
			offset_uint   = &result_uint;
			offset_uint64 = &result_uint64;
		}
		else
		{
			offset_int	= (glw::GLint*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_int_offset;
			offset_int64  = (glw::GLint64*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_int64_offset;
			offset_uint   = (glw::GLuint*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_uint_offset;
			offset_uint64 = (glw::GLuint64*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_uint64_offset;
		}

		/* Bind the QO BO if we need to use it for the getter calls */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			gl.bindBuffer(GL_QUERY_BUFFER, qo_bo_id);
		}
		else
		{
			gl.bindBuffer(GL_QUERY_BUFFER, 0 /* buffer */);
		}

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message
								  << "glBindBuffer() call failed for GL_QUERY_BUFFER target with error "
									 "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		/* Issue the getter calls.
		 *
		 * NOTE: 64-bit getter calls are supported only if >= GL 3.3*/
		if (glu::contextSupports(render_context.getType(), glu::ApiType::core(3, 3)))
		{
			gl.getQueryObjecti64v(qo_id, GL_QUERY_RESULT, offset_int64);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjecti64v() call failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			result_int64_written = true;
		}
		else
		{
			result_int64_written = false;
		}

		gl.getQueryObjectiv(qo_id, GL_QUERY_RESULT, offset_int);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectiv() call failed with error "
															  "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		if (glu::contextSupports(render_context.getType(), glu::ApiType::core(3, 3)))
		{
			gl.getQueryObjectui64v(qo_id, GL_QUERY_RESULT, offset_uint64);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectui64v() call failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			result_uint64_written = true;
		}
		else
		{
			result_uint64_written = false;
		}

		gl.getQueryObjectuiv(qo_id, GL_QUERY_RESULT, offset_uint);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectuiv() call failed with error "
															  "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		/* If the getters wrote the result values to the BO, we need to retrieve the data
		 * from the BO storage */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			/* Map the BO to process space */
			const unsigned char* bo_data_ptr = (const unsigned char*)gl.mapBuffer(GL_QUERY_BUFFER, GL_READ_ONLY);

			error_code = gl.getError();

			if (error_code != GL_NO_ERROR || bo_data_ptr == NULL)
			{
				test_context.getLog() << tcu::TestLog::Message << "QO BO mapping failed with error "
																  "["
									  << error_code << "] and data ptr returned:"
													   "["
									  << bo_data_ptr << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			/* Retrieve the query result data */
			result_int	= *(glw::GLint*)(bo_data_ptr + (int)(deIntptr)offset_int);
			result_int64  = *(glw::GLint64*)(bo_data_ptr + (int)(deIntptr)offset_int64);
			result_uint   = *(glw::GLuint*)(bo_data_ptr + (int)(deIntptr)offset_uint);
			result_uint64 = *(glw::GLuint64*)(bo_data_ptr + (int)(deIntptr)offset_uint64);

			/* Unmap the BO */
			gl.unmapBuffer(GL_QUERY_BUFFER);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "QO BO unmapping failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}
		} /* if (QO BO iteration) */

		/* Store the retrieved data in user-provided location */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			out_result->result_qo_int	= result_int;
			out_result->result_qo_int64  = result_int64;
			out_result->result_qo_uint   = result_uint;
			out_result->result_qo_uint64 = result_uint64;
		}
		else
		{
			out_result->result_int	= result_int;
			out_result->result_int64  = result_int64;
			out_result->result_uint   = result_uint;
			out_result->result_uint64 = result_uint64;
		}

		out_result->int64_written  = result_int64_written;
		out_result->uint64_written = result_uint64_written;
	} /* for (both iterations) */
	return result;
}